

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O0

void __thiscall
FIX::SocketAcceptor::SocketAcceptor
          (SocketAcceptor *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings)

{
  SessionSettings *settings_local;
  MessageStoreFactory *factory_local;
  Application *application_local;
  SocketAcceptor *this_local;
  
  Acceptor::Acceptor(&this->super_Acceptor,application,factory,settings);
  SocketServer::Strategy::Strategy(&this->super_Strategy);
  (this->super_Acceptor)._vptr_Acceptor = (_func_int **)&PTR__SocketAcceptor_003311a8;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__SocketAcceptor_00331220;
  this->m_pServer = (SocketServer *)0x0;
  std::
  map<unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
  ::map(&this->m_portToSessions);
  std::
  map<FIX::SessionID,_unsigned_short,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_unsigned_short>_>_>
  ::map(&this->m_sessionToPort);
  std::
  map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
  ::map(&this->m_connections);
  return;
}

Assistant:

EXCEPT(ConfigError)
    : Acceptor(application, factory, settings),
      m_pServer(0) {}